

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlHandle __thiscall TiXmlHandle::Child(TiXmlHandle *this,char *value,int count)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  TiXmlNode *pTVar3;
  
  if ((*(long *)value != 0) &&
     (pTVar3 = *(TiXmlNode **)(*(long *)value + 0x28), pTVar3 != (TiXmlNode *)0x0)) {
    do {
      iVar1 = strcmp(((pTVar3->value).rep_)->str,(char *)CONCAT44(in_register_00000014,count));
      if (iVar1 == 0) {
        if (in_ECX < 1) goto LAB_0018027d;
        iVar1 = 0;
        goto LAB_00180293;
      }
      pTVar3 = pTVar3->next;
    } while (pTVar3 != (TiXmlNode *)0x0);
  }
LAB_0018027a:
  pTVar3 = (TiXmlNode *)0x0;
LAB_0018027d:
  this->node = pTVar3;
  return (TiXmlHandle)(TiXmlNode *)this;
  while ((iVar2 = strcmp(((pTVar3->value).rep_)->str,(char *)CONCAT44(in_register_00000014,count)),
         iVar2 != 0 || (iVar1 = iVar1 + 1, iVar1 < in_ECX))) {
LAB_00180293:
    pTVar3 = pTVar3->next;
    if (pTVar3 == (TiXmlNode *)0x0) goto LAB_0018027a;
  }
  goto LAB_0018027d;
}

Assistant:

TiXmlHandle TiXmlHandle::Child( const char* value, int count ) const
{
	if ( node )
	{
		int i;
		TiXmlNode* child = node->FirstChild( value );
		for (	i=0;
				child && i<count;
				child = child->NextSibling( value ), ++i )
		{
			// nothing
		}
		if ( child )
			return TiXmlHandle( child );
	}
	return TiXmlHandle( 0 );
}